

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<double> expected)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  Exception *pEVar6;
  double dVar7;
  unsigned_long local_70;
  Fault f;
  ListElementCount local_5c;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  
  uVar2 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == uVar2;
  if (_kjCondition.result) {
    if (uVar2 != 0) {
      uVar1 = 0;
      uVar3 = 1;
      do {
        _kjCondition.left = (unsigned_long)expected._M_array[uVar1];
        f.exception = *(Exception **)(reader.builder.ptr + (uVar1 * reader.builder.step >> 3));
        if (((double)f.exception != (double)_kjCondition.left) ||
           (NAN((double)f.exception) || NAN((double)_kjCondition.left))) {
          dVar5 = (double)f.exception - (double)_kjCondition.left;
          dVar7 = -dVar5;
          if (-dVar5 <= dVar5) {
            dVar7 = dVar5;
          }
          pEVar6 = (Exception *)-f.exception;
          if (-f.exception <= (double)f.exception) {
            pEVar6 = f.exception;
          }
          dVar5 = -(double)_kjCondition.left;
          if (-(double)_kjCondition.left <= (double)_kjCondition.left) {
            dVar5 = (double)_kjCondition.left;
          }
          dVar5 = (dVar5 + (double)pEVar6) * 1e-12;
          local_70 = CONCAT71(local_70._1_7_,dVar7 < dVar5);
          if ((dVar5 <= dVar7) && (kj::_::Debug::minSeverity < 3)) {
            kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&,double&,double&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                       ,0x7c,ERROR,
                       "\"failed: expected \" \"::kj::_::doubleAlmostEqual(b, a)\", _kjCondition, b, a"
                       ,(char (*) [50])"failed: expected ::kj::_::doubleAlmostEqual(b, a)",
                       (DebugExpression<bool> *)&local_70,(double *)&f,(double *)&_kjCondition);
          }
        }
        else {
          local_70 = (ulong)local_70._1_7_ << 8;
        }
        bVar4 = uVar3 < uVar2;
        uVar1 = uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar4);
    }
    return;
  }
  local_5c = reader.builder.elementCount;
  local_70 = uVar2;
  _kjCondition.left = uVar2;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_70,&local_5c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}